

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O2

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createIntrinsicCall
          (LLVMReadWriteGraphBuilder *this,CallInst *CInst)

{
  undefined8 uVar1;
  long lVar2;
  Value *pVVar3;
  LLVMPointsToSetImpl *pLVar4;
  char cVar5;
  bool bVar6;
  ID IVar7;
  int iVar8;
  raw_ostream *prVar9;
  Offset o;
  RWNode *pRVar10;
  Value *pVVar11;
  undefined1 auVar12 [16];
  pair<std::_Rb_tree_iterator<const_llvm::Value_*>,_bool> pVar13;
  RWNode *local_88;
  Offset local_80;
  undefined1 local_78 [16];
  Offset local_68;
  const_iterator __begin2;
  ValInfo local_58;
  ValInfo local_50;
  Offset local_48;
  LLVMPointsToSetImpl *local_40;
  const_iterator __end2;
  
  IVar7 = llvm::IntrinsicInst::getIntrinsicID((IntrinsicInst *)CInst);
  if ((IVar7 - 0xbf < 6) && ((0x29U >> (IVar7 - 0xbf & 0x1f) & 1) != 0)) {
    uVar1 = *(undefined8 *)(CInst + -(ulong)(uint)(*(int *)(CInst + 0x14) << 5));
    lVar2 = *(long *)(CInst + -(ulong)(uint)(*(int *)(CInst + 0x14) << 5) + 0x40);
    local_88 = ReadWriteGraph::create(&this->graph,GENERIC);
    (**(code **)(*(long *)this->PTA + 0x10))(&local_48,this->PTA,uVar1);
    if ((char)local_48.offset == '\0') {
      prVar9 = (raw_ostream *)llvm::errs();
      llvm::raw_ostream::operator<<
                (prVar9,"[RWG] Error: No points-to information for destination in\n");
      prVar9 = (raw_ostream *)llvm::errs();
      local_78._0_8_ = CInst;
      prVar9 = operator<<(prVar9,(ValInfo *)local_78);
      llvm::raw_ostream::operator<<(prVar9,"\n");
    }
    pVVar3 = Offset::UNKNOWN;
    o.offset = (type)Offset::UNKNOWN;
    if (lVar2 != 0 && *(char *)(lVar2 + 0x10) == '\x10') {
      o.offset = llvm::APInt::getLimitedValue((APInt *)(lVar2 + 0x18),0xffffffffffffffff);
    }
    pLVar4 = local_40;
    if (local_40 == (LLVMPointsToSetImpl *)0x0) {
      __begin2.impl = (LLVMPointsToSetImpl *)0x0;
    }
    else {
      cVar5 = (**(code **)(*(long *)local_40 + 0x38))(local_40);
      __begin2.impl = (LLVMPointsToSetImpl *)0x0;
      if (cVar5 == '\0') {
        __begin2.impl = pLVar4;
      }
    }
    __end2.impl = (LLVMPointsToSetImpl *)0x0;
    while( true ) {
      bVar6 = LLVMPointsToSet::const_iterator::operator!=(&__begin2,&__end2);
      if (!bVar6) break;
      auVar12 = (**(code **)(*(long *)__begin2.impl + 0x48))();
      pVVar11 = auVar12._8_8_;
      local_78 = auVar12;
      if (*(char *)(auVar12._0_8_ + 0x10) != '\0') {
        if (pVVar3 == pVVar11) {
          o.offset = (type)pVVar3;
        }
        local_80.offset = (type)pVVar3;
        local_68.offset = (type)pVVar11;
        if (o.offset < (ulong)((long)pVVar3 - (long)pVVar11)) {
          local_80 = Offset::operator+(&local_68,o);
        }
        pRVar10 = getOperand(this,(Value *)local_78._0_8_);
        if (pRVar10 == (RWNode *)0x0) {
          if (createIntrinsicCall(llvm::CallInst_const*)::warned == '\0') {
            iVar8 = __cxa_guard_acquire(&createIntrinsicCall(llvm::CallInst_const*)::warned);
            if (iVar8 != 0) {
              createIntrinsicCall::warned._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                   _S_red;
              createIntrinsicCall::warned._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              createIntrinsicCall::warned._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &createIntrinsicCall::warned._M_t._M_impl.super__Rb_tree_header._M_header;
              createIntrinsicCall::warned._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   &createIntrinsicCall::warned._M_t._M_impl.super__Rb_tree_header._M_header;
              createIntrinsicCall::warned._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              __cxa_atexit(std::
                           set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                           ::~set,&createIntrinsicCall::warned,&__dso_handle);
              __cxa_guard_release(&createIntrinsicCall(llvm::CallInst_const*)::warned);
            }
          }
          pVar13 = std::
                   _Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
                   ::_M_insert_unique<llvm::Value_const*const&>
                             ((_Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
                               *)&createIntrinsicCall::warned,(Value **)local_78);
          pRVar10 = UNKNOWN_MEMORY;
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            prVar9 = (raw_ostream *)llvm::errs();
            prVar9 = llvm::raw_ostream::operator<<(prVar9,"[RWG] error at ");
            local_50.v = (Value *)CInst;
            prVar9 = operator<<(prVar9,&local_50);
            prVar9 = llvm::raw_ostream::operator<<(prVar9,"\n");
            prVar9 = llvm::raw_ostream::operator<<
                               (prVar9,"[RWG] error: Haven\'t created node for: ");
            local_58.v = (Value *)local_78._0_8_;
            prVar9 = operator<<(prVar9,&local_58);
            llvm::raw_ostream::operator<<(prVar9,"\n");
            pRVar10 = UNKNOWN_MEMORY;
          }
        }
        RWNode::addDef(local_88,pRVar10,&local_68,&local_80,
                       (Value *)local_80.offset != pVVar3 && (Value *)local_68.offset != pVVar3);
      }
      LLVMPointsToSet::const_iterator::operator++(&__begin2);
    }
    if (local_40 != (LLVMPointsToSetImpl *)0x0) {
      (**(code **)(*(long *)local_40 + 0x58))();
    }
  }
  else {
    if (IVar7 != 0x134) {
      pRVar10 = createUnknownCall(this,CInst);
      return pRVar10;
    }
    local_88 = ReadWriteGraph::create(&this->graph,ALLOC);
    local_48.offset = 0;
    local_78._0_8_ = Offset::UNKNOWN;
    RWNode::addDef(local_88,local_88,&local_48,(Offset *)local_78,false);
  }
  return local_88;
}

Assistant:

RWNode *
LLVMReadWriteGraphBuilder::createIntrinsicCall(const llvm::CallInst *CInst) {
    using namespace llvm;

    const IntrinsicInst *I = cast<IntrinsicInst>(CInst);
    const Value *dest;
    const Value *lenVal;

    RWNode *ret;
    switch (I->getIntrinsicID()) {
    case Intrinsic::memmove:
    case Intrinsic::memcpy:
    case Intrinsic::memset:
        // memcpy/set <dest>, <src/val>, <len>
        dest = I->getOperand(0);
        lenVal = I->getOperand(2);
        break;
    case Intrinsic::vastart:
        // we create this node because this nodes works
        // as ALLOC in points-to, so we can have
        // reaching definitions to that
        ret = &create(RWNodeType::ALLOC);
        ret->addDef(ret, 0, Offset::UNKNOWN);
        return ret;
    default:
        return createUnknownCall(CInst);
    }

    ret = &create(RWNodeType::GENERIC);

    auto pts = PTA->getLLVMPointsToChecked(dest);
    if (!pts.first) {
        llvm::errs()
                << "[RWG] Error: No points-to information for destination in\n";
        llvm::errs() << ValInfo(I) << "\n";
        // continue, the points-to set is {unknown}
    }

    uint64_t len = Offset::UNKNOWN;
    if (const ConstantInt *C = dyn_cast<ConstantInt>(lenVal))
        len = C->getLimitedValue();

    for (const auto &ptr : pts.second) {
        if (llvm::isa<llvm::Function>(ptr.value))
            continue;

        Offset from, to;
        if (ptr.offset.isUnknown()) {
            // if the offset is UNKNOWN, use whole memory
            from = Offset::UNKNOWN;
            len = Offset::UNKNOWN;
        } else {
            from = *ptr.offset;
        }

        // do not allow overflow
        if (Offset::UNKNOWN - *from > len)
            to = from + len;
        else
            to = Offset::UNKNOWN;

        RWNode *target = getOperand(ptr.value);
        // assert(target && "Don't have pointer target for intrinsic call");
        if (!target) {
            // keeping such set is faster then printing it all to terminal
            // ... and we don't flood the terminal that way
            static std::set<const llvm::Value *> warned;
            if (warned.insert(ptr.value).second) {
                llvm::errs() << "[RWG] error at " << ValInfo(CInst) << "\n"
                             << "[RWG] error: Haven't created node for: "
                             << ValInfo(ptr.value) << "\n";
            }
            target = UNKNOWN_MEMORY;
        }

        // add the definition
        ret->addDef(target, from, to,
                    !from.isUnknown() && !to.isUnknown() /* strong update */);
    }

    return ret;
}